

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

BeliefSetNonStationary * __thiscall
AlphaVectorPlanning::SampleBeliefsNonStationary
          (BeliefSetNonStationary *__return_storage_ptr__,AlphaVectorPlanning *this,int nrBeliefs,
          int uniqueBeliefs,int resetAfter,int useQMDPforSamplingBeliefs,double QMDPexploreProb)

{
  size_t sVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  undefined4 extraout_var;
  JointBeliefInterface *jb;
  ostream *poVar11;
  PlanningUnitDecPOMDPDiscrete *pPVar12;
  undefined8 uVar13;
  long *plVar14;
  E *this_00;
  int iVar15;
  BeliefSetNonStationary *S;
  string local_58;
  double local_38;
  undefined4 extraout_var_00;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)QMDPexploreProb,&local_58,"SampleBeliefsNonStationary","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar12 = this->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->_m_puShared).px;
  }
  sVar1 = (pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  sVar10 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
  pPVar12 = this->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->_m_puShared).px;
  }
  iVar5 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar12 = this->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->_m_puShared).px;
  }
  iVar6 = (*(pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar12,(long)(int)sVar10);
  plVar14 = (long *)CONCAT44(extraout_var,iVar6);
  pPVar12 = this->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->_m_puShared).px;
  }
  iVar6 = (*(pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar12,(long)(int)sVar10);
  jb = (JointBeliefInterface *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (int)sVar1;
  if (nrBeliefs <= iVar6) {
    nrBeliefs = iVar6 + 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling "
               ,0x70);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nrBeliefs);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," beliefs",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if (iVar6 != 999999) {
    BeliefSetNonStationary::BeliefSetNonStationary(__return_storage_ptr__,(long)iVar6);
    if (resetAfter == 0) {
      resetAfter = iVar6;
    }
    if (iVar6 < resetAfter) {
      resetAfter = iVar6;
    }
    local_38 = (double)iVar5;
    iVar15 = 0;
    iVar6 = 0;
    uVar8 = 0;
    for (iVar5 = 0; (iVar6 < nrBeliefs && (iVar5 < nrBeliefs * 2)); iVar5 = iVar5 + (uint)!bVar4) {
      if (resetAfter < iVar15) {
        iVar15 = 0;
      }
      if (iVar15 == 0) {
        pPVar12 = this->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->_m_puShared).px;
        }
        pDVar2 = pPVar12->_m_DecPOMDP;
        uVar8 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x160))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
        pPVar12 = this->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->_m_puShared).px;
        }
        lVar3 = *(long *)((long)*jb + -0xb8);
        uVar13 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 0x50))();
        (**(code **)(*(long *)(&jb->field_0x0 + lVar3) + 0x28))(&jb->field_0x0 + lVar3,uVar13);
      }
      else {
        iVar7 = rand();
        pPVar12 = this->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->_m_puShared).px;
        }
        iVar7 = (int)((double)iVar7 * 4.656612873077393e-10 * local_38);
        pDVar2 = pPVar12->_m_DecPOMDP;
        uVar8 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x148))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8),uVar8,iVar7
                          );
        pPVar12 = this->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->_m_puShared).px;
        }
        pDVar2 = pPVar12->_m_DecPOMDP;
        uVar9 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x150))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8),iVar7,uVar8
                          );
        (**(code **)((long)*jb + 0xa8))(jb,plVar14);
        pPVar12 = this->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->_m_puShared).px;
        }
        (**(code **)((long)*jb + 0xb0))
                  (jb,(long)&pPVar12->_m_DecPOMDP->field_0x0 +
                      *(long *)(*(long *)pPVar12->_m_DecPOMDP + -0xb8),iVar7,uVar9);
      }
      bVar4 = BeliefSetNonStationary::Add(__return_storage_ptr__,(long)iVar15,jb,uniqueBeliefs != 0)
      ;
      iVar6 = iVar6 + (uint)bVar4;
      iVar15 = iVar15 + 1;
      (**(code **)(*plVar14 + 0xa8))(plVar14,jb);
    }
    if (plVar14 != (long *)0x0) {
      (**(code **)(*plVar14 + 8))();
    }
    if (jb != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*jb + 8))();
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"SampleBeliefsNonStationary","");
    TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 < nrBeliefs) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Warning, only managed to sample ",0x20);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," unique beliefs instead of ",0x1b)
      ;
      plVar14 = (long *)std::ostream::operator<<((ostream *)poVar11,nrBeliefs);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
    }
    return __return_storage_ptr__;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "AlphaVectorPlanning::SampleBeliefsNonStationary does not make sense in an infinite-horizon setting"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

BeliefSetNonStationary
AlphaVectorPlanning::SampleBeliefsNonStationary(
    int nrBeliefs,
    int uniqueBeliefs,
    int resetAfter,
    int useQMDPforSamplingBeliefs,
    double QMDPexploreProb) const
{
    StartTimer("SampleBeliefsNonStationary");
    
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;

    if(nrBeliefs<=h)
    {
        nrBeliefs=h+1;
        cout << "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling " << h+1 << " beliefs" << endl;
    }

    if(h==static_cast<int>(MAXHORIZON))
        throw(E("AlphaVectorPlanning::SampleBeliefsNonStationary does not make sense in an infinite-horizon setting"));

    BeliefSetNonStationary S(h);

    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
        resetAfter=h;

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<nrBeliefs)
    while(i<nrBeliefs && nrEqualFound<(nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            // sample an action uniformly at random
            a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);

            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(S.Add(d,b1,uniqueBeliefs)) // we add it
            i++;
        else
            nrEqualFound++;

        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;

    StopTimer("SampleBeliefsNonStationary");

    // we did not manage to sample nrBeliefs unique beliefs
    if(i<nrBeliefs)
    {
        cout << "Warning, only managed to sample " << i 
             << " unique beliefs instead of " << nrBeliefs << endl;
    }

    return(S);
}